

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

DebuggerScope * __thiscall
Js::DebuggerScope::FindCommonAncestor(DebuggerScope *this,DebuggerScope *debuggerScope)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 *puVar6;
  DebuggerScope *pDVar7;
  int iVar8;
  
  if (debuggerScope == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x17ee,"(debuggerScope)","debuggerScope");
    if (!bVar2) {
LAB_006d2e99:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  pDVar7 = debuggerScope;
  if (((this != debuggerScope) && (bVar2 = IsAncestorOf(this,debuggerScope), pDVar7 = this, !bVar2))
     && (bVar2 = IsAncestorOf(debuggerScope,this), pDVar7 = debuggerScope, !bVar2)) {
    iVar3 = GetScopeDepth(this);
    iVar4 = GetScopeDepth(debuggerScope);
    iVar5 = iVar3 - iVar4;
    iVar8 = -iVar5;
    if (0 < iVar5) {
      iVar8 = iVar5;
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (; 0 < iVar8; iVar8 = iVar8 + -1) {
      pDVar7 = debuggerScope;
      if (iVar4 < iVar3) {
        pDVar7 = this;
      }
      if (pDVar7 == (DebuggerScope *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x180c,"(nodeToBringUp)","nodeToBringUp");
        if (!bVar2) goto LAB_006d2e99;
        *puVar6 = 0;
      }
      pDVar7 = (pDVar7->parentScope).ptr;
      if (iVar3 <= iVar4) {
        debuggerScope = pDVar7;
        pDVar7 = this;
      }
      this = pDVar7;
    }
    for (; ((pDVar7 = (DebuggerScope *)0x0, this != (DebuggerScope *)0x0 &&
            (debuggerScope != (DebuggerScope *)0x0)) && (pDVar7 = this, this != debuggerScope));
        this = (this->parentScope).ptr) {
      debuggerScope = (debuggerScope->parentScope).ptr;
    }
  }
  return pDVar7;
}

Assistant:

DebuggerScope* DebuggerScope::FindCommonAncestor(DebuggerScope* debuggerScope)
    {
        AnalysisAssert(debuggerScope);

        if (this == debuggerScope)
        {
            return debuggerScope;
        }

        if (this->IsAncestorOf(debuggerScope))
        {
            return this;
        }

        if (debuggerScope->IsAncestorOf(this))
        {
            return debuggerScope;
        }

        DebuggerScope* firstNode = this;
        DebuggerScope* secondNode = debuggerScope;

        int firstDepth = firstNode->GetScopeDepth();
        int secondDepth = secondNode->GetScopeDepth();

        // Calculate the depth difference in order to bring the deep node up to the sibling
        // level of the shorter node.
        int depthDifference = abs(firstDepth - secondDepth);

        DebuggerScope*& nodeToBringUp = firstDepth > secondDepth ? firstNode : secondNode;
        while (depthDifference > 0)
        {
            AnalysisAssert(nodeToBringUp);
            nodeToBringUp = nodeToBringUp->GetParentScope();
            --depthDifference;
        }

        // Move up the tree and see where the nodes meet.
        while (firstNode && secondNode)
        {
            if (firstNode == secondNode)
            {
                return firstNode;
            }

            firstNode = firstNode->GetParentScope();
            secondNode = secondNode->GetParentScope();
        }

        // The nodes are not part of the same scope tree.
        return nullptr;
    }